

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

void __thiscall MT32Emu::Display::rhythmNotePlayed(Display *this)

{
  bool bVar1;
  Display *this_local;
  
  this->rhythmNotePlayedSinceLastReset = true;
  this->rhythmStateResetTimestamp = this->synth->renderedSampleCount + 0xa00;
  midiMessagePlayed(this);
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if ((bVar1) && (this->mode == Mode_CUSTOM_MESSAGE)) {
    setMainDisplayMode(this);
  }
  return;
}

Assistant:

void Display::rhythmNotePlayed() {
	rhythmNotePlayedSinceLastReset = true;
	rhythmStateResetTimestamp = synth.renderedSampleCount + BLINK_TIME_FRAMES;
	midiMessagePlayed();
	if (synth.isDisplayOldMT32Compatible() && mode == Mode_CUSTOM_MESSAGE) setMainDisplayMode();
}